

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messaging.cpp
# Opt level: O3

Document * getMessage(void)

{
  Number NVar1;
  size_t sVar2;
  ostream *poVar3;
  Number *in_RDI;
  string buffer;
  char *local_b8;
  long local_b0;
  char local_a8;
  undefined7 uStack_a7;
  Data local_98;
  Number local_88;
  Number NStack_80;
  Number local_78;
  Number NStack_70;
  Number local_68;
  Number NStack_60;
  Number local_58;
  Number NStack_50;
  int local_48;
  uint uStack_44;
  Number NStack_40;
  GenericStringStream<rapidjson::UTF8<char>_> local_38;
  
  sVar2 = readHeaders();
  local_b0 = 0;
  local_a8 = '\0';
  local_b8 = &local_a8;
  for (; sVar2 != 0; sVar2 = sVar2 - 1) {
    getchar();
    std::__cxx11::string::push_back((char)&local_b8);
  }
  rapidjson::
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  ::GenericDocument((GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                     *)&local_98.s,(MemoryPoolAllocator<rapidjson::CrtAllocator> *)0x0,0x400,
                    (CrtAllocator *)0x0);
  local_38.src_ = local_b8;
  local_38.head_ = local_b8;
  rapidjson::
  GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>
  ::ParseStream<0u,rapidjson::UTF8<char>,rapidjson::GenericStringStream<rapidjson::UTF8<char>>>
            ((GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>
              *)&local_98.s,&local_38);
  if (local_48 == 0) {
    NVar1.i64._6_2_ = local_98.f.flags;
    NVar1.i64._0_6_ = local_98._8_6_;
    *in_RDI = local_98.n;
    in_RDI[1] = NVar1;
    local_98.f.flags = 0;
    in_RDI[2] = local_88;
    in_RDI[3] = NStack_80;
    in_RDI[4] = local_78;
    in_RDI[5] = NStack_70;
    in_RDI[6] = local_68;
    in_RDI[7] = NStack_60;
    in_RDI[8] = local_58;
    in_RDI[9] = NStack_50;
    local_58.i64 = 0;
    NStack_50.i64 = 0;
    local_68.i64 = 0;
    NStack_60.i64 = 0;
    local_78.i64 = 0;
    NStack_70.i64 = 0;
    in_RDI[10].u64 = (ulong)uStack_44 << 0x20;
    in_RDI[0xb] = NStack_40;
    NStack_40.i64 = 0;
    local_88.i64 = 0;
    NStack_80.i64 = 0;
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"!!!Error parsing JSON\n",0x16);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,local_b8,local_b0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error code: ",0xc);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
    sendError((Id *)0x0,ParseError,"Failed to parse JSON",(Value *)0x0);
    getMessage();
  }
  rapidjson::
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  ::~GenericDocument((GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                      *)&local_98.s);
  if (local_b8 != &local_a8) {
    operator_delete(local_b8,CONCAT71(uStack_a7,local_a8) + 1);
  }
  return (Document *)in_RDI;
}

Assistant:

Document getMessage () {
    size_t length = readHeaders();

    string buffer;

    for (size_t i = 0; i < length; i++) {
        char c = static_cast<char>(getchar());
        buffer += c;
    }

//    std::cerr << "INCOMING\n";
//    std::cerr << buffer << "\n\n";

    Document json;
    json.Parse(buffer);

    if (json.HasParseError()) {
        std::cerr << "!!!Error parsing JSON\n";
        std::cerr << buffer << "\n";

        auto error = json.GetParseError();
        std::cerr << "Error code: " << error << "\n";

        sendError(nullptr, ResponseHandler::ErrorCode::ParseError, "Failed to parse JSON");

        return getMessage();
    }

    return json;
}